

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::generateFragShaderOutAssign
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,string *valuePrefix,
               string *outputPrefix)

{
  int iVar1;
  DataType DVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined3 in_register_00000011;
  int iVar5;
  char *pcVar6;
  pointer pSVar7;
  char *pcVar8;
  bool bVar9;
  
  pSVar7 = (shaderSpec->outputs).
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = " = ";
  bVar9 = CONCAT31(in_register_00000011,useIntOutputs) != 0;
  if (bVar9) {
    pcVar4 = " = floatBitsToUint(";
  }
  pcVar8 = "];\n";
  if (bVar9) {
    pcVar8 = "]);\n";
  }
  do {
    if (pSVar7 == (shaderSpec->outputs).
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    DVar2 = (pSVar7->varType).m_data.basic.type;
    if ((useIntOutputs) && (DVar2 - TYPE_FLOAT < 4)) {
      poVar3 = std::operator<<(src,"\to_");
      poVar3 = std::operator<<(poVar3,(string *)pSVar7);
      pcVar6 = " = floatBitsToUint(";
LAB_00866afc:
      poVar3 = std::operator<<(poVar3,pcVar6);
      pcVar6 = ");\n";
LAB_00866b08:
      poVar3 = std::operator<<(poVar3,(string *)valuePrefix);
      poVar3 = std::operator<<(poVar3,(string *)pSVar7);
      std::operator<<(poVar3,pcVar6);
    }
    else {
      if (8 < DVar2 - TYPE_FLOAT_MAT2 && 8 < DVar2 - TYPE_DOUBLE_MAT2) {
        if (DVar2 - TYPE_BOOL < 4) {
          iVar1 = glu::getDataTypeScalarSize(DVar2);
          DVar2 = TYPE_INT;
          if (1 < iVar1) {
            DVar2 = glu::getDataTypeIntVec(iVar1);
          }
          poVar3 = std::operator<<(src,"\t");
          poVar3 = std::operator<<(poVar3,(string *)outputPrefix);
          poVar3 = std::operator<<(poVar3,(string *)pSVar7);
          poVar3 = std::operator<<(poVar3," = ");
          pcVar6 = glu::getDataTypeName(DVar2);
          poVar3 = std::operator<<(poVar3,pcVar6);
          pcVar6 = "(";
          goto LAB_00866afc;
        }
        poVar3 = std::operator<<(src,"\t");
        poVar3 = std::operator<<(poVar3,(string *)outputPrefix);
        poVar3 = std::operator<<(poVar3,(string *)pSVar7);
        poVar3 = std::operator<<(poVar3," = ");
        pcVar6 = ";\n";
        goto LAB_00866b08;
      }
      iVar1 = glu::getDataTypeMatrixNumColumns(DVar2);
      iVar5 = 0;
      if (iVar1 < 1) {
        iVar1 = iVar5;
      }
      for (; iVar1 != iVar5; iVar5 = iVar5 + 1) {
        poVar3 = std::operator<<(src,"\t");
        poVar3 = std::operator<<(poVar3,(string *)outputPrefix);
        poVar3 = std::operator<<(poVar3,(string *)pSVar7);
        poVar3 = std::operator<<(poVar3,"_");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,(string *)valuePrefix);
        poVar3 = std::operator<<(poVar3,(string *)pSVar7);
        poVar3 = std::operator<<(poVar3,"[");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
        std::operator<<(poVar3,pcVar8);
      }
    }
    pSVar7 = pSVar7 + 1;
  } while( true );
}

Assistant:

static void generateFragShaderOutAssign (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::string& valuePrefix, const std::string& outputPrefix)
{
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (useIntOutputs && glu::isDataTypeFloatOrVec(output->varType.getBasicType()))
			src << "	o_" << output->name << " = floatBitsToUint(" << valuePrefix << output->name << ");\n";
		else if (glu::isDataTypeMatrix(output->varType.getBasicType()))
		{
			const int	numVecs		= glu::getDataTypeMatrixNumColumns(output->varType.getBasicType());

			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
				if (useIntOutputs)
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = floatBitsToUint(" << valuePrefix << output->name << "[" << vecNdx << "]);\n";
				else
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = " << valuePrefix << output->name << "[" << vecNdx << "];\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

			src << "\t" << outputPrefix << output->name << " = " << glu::getDataTypeName(intBaseType) << "(" << valuePrefix << output->name << ");\n";
		}
		else
			src << "\t" << outputPrefix << output->name << " = " << valuePrefix << output->name << ";\n";
	}
}